

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Split * wasm::String::handleBracketingOperators(Split *__return_storage_ptr__,Split *split)

{
  bool bVar1;
  Fatal local_260;
  allocator<char> local_d1;
  string local_d0;
  string local_a0;
  reference local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *part;
  iterator __end2;
  iterator __begin2;
  Split *__range2;
  anon_class_24_3_616f249e handlePart;
  string local_40 [4];
  int nesting;
  string last;
  Split *split_local;
  Split *ret;
  
  if ((split->needToHandleBracketingOperations & 1U) == 0) {
    Split::Split(__return_storage_ptr__,split);
  }
  else {
    last.field_2._M_local_buf[0xf] = '\0';
    Split::Split(__return_storage_ptr__);
    std::__cxx11::string::string(local_40);
    handlePart.ret._4_4_ = 0;
    __range2 = (Split *)((long)&handlePart.ret + 4);
    handlePart.nesting = (int *)local_40;
    handlePart.last = (string *)__return_storage_ptr__;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&split->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
    part = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&split->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&part), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_a0,(string *)local_80);
      handleBracketingOperators::anon_class_24_3_616f249e::operator()
                ((anon_class_24_3_616f249e *)&__range2,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    handleBracketingOperators::anon_class_24_3_616f249e::operator()
              ((anon_class_24_3_616f249e *)&__range2,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    if (handlePart.ret._4_4_ != 0) {
      Fatal::Fatal(&local_260);
      Fatal::operator<<(&local_260,(char (*) [32])"Asyncify: failed to parse lists");
      Fatal::~Fatal(&local_260);
    }
    last.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string(local_40);
    if ((last.field_2._M_local_buf[0xf] & 1U) == 0) {
      Split::~Split(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Split handleBracketingOperators(Split split) {
  if (!split.needToHandleBracketingOperations) {
    return split;
  }

  Split ret;
  std::string last;
  int nesting = 0;
  auto handlePart = [&](std::string part) {
    if (part.empty()) {
      return;
    }
    for (const char c : part) {
      if (c == '(' || c == '<' || c == '[' || c == '{') {
        nesting++;
      } else if (c == ')' || c == '>' || c == ']' || c == '}') {
        nesting--;
      }
    }
    if (last.empty()) {
      last = part;
    } else {
      last += ',' + part;
    }
    if (nesting == 0) {
      ret.push_back(last);
      last.clear();
    }
  };
  for (auto& part : split) {
    handlePart(part);
  }
  handlePart("");
  if (nesting != 0) {
    Fatal() << "Asyncify: failed to parse lists";
  }
  return ret;
}